

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg4.hpp
# Opt level: O3

ret_t trng::utility::u01xx_traits<double,_1UL,_trng::mrg4>::addin(mrg4 *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar3 = (r->S).r[0];
  iVar1 = (r->S).r[1];
  iVar2 = (r->S).r[2];
  uVar4 = (long)(r->S).r[3] * (long)(r->P).a[3] + (long)(r->P).a[2] * (long)iVar2 +
          (long)(r->P).a[1] * (long)iVar1 + (long)(r->P).a[0] * (long)iVar3;
  (r->S).r[3] = iVar2;
  (r->S).r[2] = iVar1;
  (r->S).r[1] = iVar3;
  uVar5 = (uVar4 >> 0x1f) + (uVar4 & 0x7fffffff);
  uVar4 = uVar5 - 0x1fffffffc;
  if ((uint)(uVar5 >> 2) < 0x7fffffff) {
    uVar4 = uVar5;
  }
  uVar5 = uVar4 - 0xfffffffe;
  if (uVar4 < 0xfffffffe) {
    uVar5 = uVar4;
  }
  iVar3 = (int)uVar5 + -0x7fffffff;
  if (uVar5 < 0x7fffffff) {
    iVar3 = (int)uVar5;
  }
  (r->S).r[0] = iVar3;
  return (double)iVar3;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg4::step() {
    const uint64_t t{static_cast<uint64_t>(P.a[0]) * static_cast<uint64_t>(S.r[0]) +
                     static_cast<uint64_t>(P.a[1]) * static_cast<uint64_t>(S.r[1]) +
                     static_cast<uint64_t>(P.a[2]) * static_cast<uint64_t>(S.r[2]) +
                     static_cast<uint64_t>(P.a[3]) * static_cast<uint64_t>(S.r[3])};
    S.r[3] = S.r[2];
    S.r[2] = S.r[1];
    S.r[1] = S.r[0];
    S.r[0] = int_math::modulo<modulus, 4>(t);
  }